

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O1

uint8_t __thiscall AmpIO::GetAmpTemperature(AmpIO *this,uint index)

{
  uint8_t uVar1;
  uint32_t uVar2;
  
  if (index == 1) {
    uVar1 = (uint8_t)this->ReadBuffer[3];
  }
  else if (index == 0) {
    uVar1 = *(uint8_t *)((long)this->ReadBuffer + 0xd);
  }
  else {
    uVar2 = BoardIO::GetHardwareVersion((BoardIO *)this);
    if (uVar2 == 0x44514c41) {
      if (index == 3) {
        return *(uint8_t *)((long)this->ReadBuffer + 0xe);
      }
      if (index == 2) {
        return *(uint8_t *)((long)this->ReadBuffer + 0xf);
      }
    }
    uVar1 = '\0';
  }
  return uVar1;
}

Assistant:

uint8_t AmpIO::GetAmpTemperature(unsigned int index) const
{
    uint8_t temp = 0;
    if (index == 0)
        temp = (ReadBuffer[TEMP_OFFSET]>>8) & 0x000000ff;
    else if (index == 1)
        temp = ReadBuffer[TEMP_OFFSET] & 0x000000ff;
    else if (GetHardwareVersion() == DQLA_String) {
        if (index == 2)
            temp = (ReadBuffer[TEMP_OFFSET]>>24) & 0x000000ff;
        else if (index == 3)
            temp = (ReadBuffer[TEMP_OFFSET]>>16) & 0x000000ff;
    }
    return temp;
}